

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment_uri.h
# Opt level: O0

bool __thiscall ktx::SelectorRange::is_empty(SelectorRange *this)

{
  bool bVar1;
  vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_> *in_RDI;
  HalfRange *range;
  const_iterator __end2;
  const_iterator __begin2;
  vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_> *__range2;
  reference in_stack_ffffffffffffffd0;
  __normal_iterator<const_ktx::SelectorRange::HalfRange_*,_std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>_>
  in_stack_ffffffffffffffe0;
  
  bVar1 = std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
          ::empty((vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                   *)in_stack_ffffffffffffffe0._M_current);
  if (!bVar1) {
    std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
    begin(in_RDI);
    std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::end
              (in_RDI);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_ktx::SelectorRange::HalfRange_*,_std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>_>
                               *)in_stack_ffffffffffffffd0,
                              (__normal_iterator<const_ktx::SelectorRange::HalfRange_*,_std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>_>
                               *)in_RDI), bVar1) {
      in_stack_ffffffffffffffd0 =
           __gnu_cxx::
           __normal_iterator<const_ktx::SelectorRange::HalfRange_*,_std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>_>
           ::operator*((__normal_iterator<const_ktx::SelectorRange::HalfRange_*,_std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>_>
                        *)&stack0xffffffffffffffe0);
      if (in_stack_ffffffffffffffd0->begin != in_stack_ffffffffffffffd0->end) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<const_ktx::SelectorRange::HalfRange_*,_std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>_>
      ::operator++((__normal_iterator<const_ktx::SelectorRange::HalfRange_*,_std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>_>
                    *)&stack0xffffffffffffffe0);
    }
  }
  return true;
}

Assistant:

[[nodiscard]] bool is_empty() const {
        if (ranges.empty())
            return true;
        for (const auto& range : ranges)
            if (range.begin != range.end)
                return false;
        return true;
    }